

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O3

ON_ArchivableDictionaryPrivate * __thiscall
ON_ArchivableDictionaryPrivate::operator=
          (ON_ArchivableDictionaryPrivate *this,ON_ArchivableDictionaryPrivate *other)

{
  DictionaryEntry *pDVar1;
  mapped_type *pmVar2;
  DictionaryEntry *pDVar3;
  _Rb_tree_node_base *p_Var4;
  
  this->m_version = other->m_version;
  ON_wString::operator=(&this->m_name,&other->m_name);
  std::
  _Rb_tree<ON_wString,_std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>,_std::_Select1st<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
  ::clear(&(this->m_map)._M_t);
  for (p_Var4 = (other->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(other->m_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    pmVar2 = std::
             map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
             ::operator[](&this->m_map,(key_type *)(p_Var4 + 1));
    pDVar3 = (DictionaryEntry *)(**(code **)(*(long *)p_Var4[1]._M_parent + 0x18))();
    pDVar1 = (pmVar2->_M_t).
             super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
             super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
             super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl;
    (pmVar2->_M_t).super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>.
    _M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
    super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl = pDVar3;
    if (pDVar1 != (DictionaryEntry *)0x0) {
      (*pDVar1->_vptr_DictionaryEntry[1])();
    }
  }
  return this;
}

Assistant:

ON_ArchivableDictionaryPrivate& operator=(const ON_ArchivableDictionaryPrivate& other)
  {
    m_version = other.m_version;
    m_name = other.m_name;

    m_map.clear();
    for (const auto & item : other.m_map)
    {
      const auto& key = item.first;
      const auto& value = item.second;
      m_map[key].reset(value->Duplicate());
    }

    return *this;
  }